

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int IDAGetNumLinResEvals(void *ida_mem,long *nrevalsLS)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_18;
  IDAMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetNumLinResEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *nrevalsLS = local_18->nreDQ;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetNumLinResEvals(void* ida_mem, long int* nrevalsLS)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; store output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }
  *nrevalsLS = idals_mem->nreDQ;
  return (IDALS_SUCCESS);
}